

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDComponentPtr __thiscall ON_SubDComponentPtr::PrevComponent(ON_SubDComponentPtr *this)

{
  ulong uVar1;
  
  uVar1 = this->m_ptr;
  switch((uint)uVar1 & 6) {
  case 2:
    if (((uVar1 & 0xfffffffffffffff8) != 0) &&
       (uVar1 = *(ulong *)((uVar1 & 0xfffffffffffffff8) + 0x50), uVar1 != 0)) {
      return (ON_SubDComponentPtr)(uVar1 | 2);
    }
    break;
  case 4:
    if (((uVar1 & 0xfffffffffffffff8) != 0) &&
       (uVar1 = *(ulong *)((uVar1 & 0xfffffffffffffff8) + 0x50), uVar1 != 0)) {
      return (ON_SubDComponentPtr)(uVar1 | 4);
    }
    break;
  case 6:
    if (((uVar1 & 0xfffffffffffffff8) != 0) &&
       (uVar1 = *(ulong *)((uVar1 & 0xfffffffffffffff8) + 0x50), uVar1 != 0)) {
      return (ON_SubDComponentPtr)(uVar1 | 6);
    }
  }
  return (ON_SubDComponentPtr)0;
}

Assistant:

const ON_SubDComponentPtr ON_SubDComponentPtr::PrevComponent() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = ON_SUBD_VERTEX_POINTER(m_ptr);
    if (nullptr != v)
      return ON_SubDComponentPtr::Create(v->m_prev_vertex);
  }
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr != e)
      return ON_SubDComponentPtr::Create(e->m_prev_edge);
  }
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(m_ptr);
    if (nullptr != f)
      return ON_SubDComponentPtr::Create(f->m_prev_face);
  }
  default:
    break;
  }
  return ON_SubDComponentPtr::Null;
}